

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O3

void __thiscall
bidirectional::BiDirectional::BiDirectional
          (BiDirectional *this,int *number_vertices,int *number_edges,int *source_id,int *sink_id,
          vector<double,_std::allocator<double>_> *max_res_in,
          vector<double,_std::allocator<double>_> *min_res_in)

{
  double dVar1;
  logger *this_00;
  Params *this_01;
  DiGraph *this_02;
  Search *pSVar2;
  pointer *__ptr;
  Directions local_70;
  undefined4 uStack_6c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  vector<double,_std::allocator<double>_> *local_60;
  int *local_58;
  string local_50;
  
  local_58 = sink_id;
  std::vector<double,_std::allocator<double>_>::vector(&this->max_res,max_res_in);
  std::vector<double,_std::allocator<double>_>::vector(&this->min_res,min_res_in);
  local_60 = &this->min_res;
  this_01 = (Params *)operator_new(0x48);
  Params::Params(this_01);
  (this->params_ptr_)._M_t.
  super___uniq_ptr_impl<bidirectional::Params,_std::default_delete<bidirectional::Params>_>._M_t.
  super__Tuple_impl<0UL,_bidirectional::Params_*,_std::default_delete<bidirectional::Params>_>.
  super__Head_base<0UL,_bidirectional::Params_*,_false>._M_head_impl = this_01;
  this_02 = (DiGraph *)operator_new(0x58);
  DiGraph::DiGraph(this_02,number_vertices,number_edges,source_id,local_58);
  (this->graph_ptr_)._M_t.
  super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>._M_t.
  super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>.
  super__Head_base<0UL,_bidirectional::DiGraph_*,_false>._M_head_impl = this_02;
  (this->start_time_).__d.__r = 0;
  dVar1 = nan("nan");
  this->primal_st_bound_ = dVar1;
  this->iteration_ = 0;
  this->terminated_early_w_st_path_ = false;
  (this->max_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->max_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->max_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->min_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->min_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->min_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->best_label_).super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->best_label_).super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_70 = FWD;
  pSVar2 = (Search *)operator_new(0xa8);
  Search::Search(pSVar2,&local_70);
  (this->fwd_search_ptr_)._M_t.
  super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>._M_t.
  super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>.
  super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl = pSVar2;
  local_70 = BWD;
  pSVar2 = (Search *)operator_new(0xa8);
  Search::Search(pSVar2,&local_70);
  (this->bwd_search_ptr_)._M_t.
  super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>._M_t.
  super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>.
  super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl = pSVar2;
  spdlog::default_logger();
  this_00 = (logger *)CONCAT44(uStack_6c,local_70);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"%v","");
  spdlog::logger::set_pattern(this_00,&local_50,local);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  return;
}

Assistant:

BiDirectional::BiDirectional(
    const int&                 number_vertices,
    const int&                 number_edges,
    const int&                 source_id,
    const int&                 sink_id,
    const std::vector<double>& max_res_in,
    const std::vector<double>& min_res_in)
    : max_res(max_res_in),
      min_res(min_res_in),
      // Private pointer initialisations
      params_ptr_(std::make_unique<bidirectional::Params>()),
      graph_ptr_(std::make_unique<DiGraph>(
          number_vertices,
          number_edges,
          source_id,
          sink_id)),
      fwd_search_ptr_(std::make_unique<bidirectional::Search>(FWD)),
      bwd_search_ptr_(std::make_unique<bidirectional::Search>(BWD)) {
#if SPDLOG_ACTIVE_LEVEL == SPDLOG_LEVEL_DEBUG
  // Needed as not printed otherwise
  spdlog::set_level(spdlog::level::debug);
#endif
  spdlog::default_logger()->set_pattern("%v");
  SPDLOG_INFO(
      "************************************************************************"
      "********");
  // spdlog::set_pattern("%+"); // back to default format
}